

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O1

void __thiscall OpenMD::ZConstraintForceModifier::zeroVelocity(ZConstraintForceModifier *this)

{
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *plVar1;
  Molecule *pMVar2;
  pointer ppSVar3;
  long lVar4;
  _List_node_base *p_Var5;
  double dVar6;
  pointer ppSVar7;
  pointer ppMVar8;
  _List_node_base *p_Var9;
  pointer ppMVar10;
  StuntDouble *pSVar11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  RealType RVar14;
  double dVar15;
  Vector3d local_40;
  
  p_Var9 = (this->fixedZMols_).
           super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)&this->fixedZMols_) {
    do {
      pMVar2 = (Molecule *)p_Var9[1]._M_next;
      Molecule::getComVel(&local_40,pMVar2);
      ppSVar7 = (pMVar2->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar7 ==
          (pMVar2->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar11 = (StuntDouble *)0x0;
      }
      else {
        pSVar11 = *ppSVar7;
      }
      if (pSVar11 != (StuntDouble *)0x0) {
        ppSVar3 = (pMVar2->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        do {
          ppSVar7 = ppSVar7 + 1;
          lVar4 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
          *(double *)(lVar4 + 0x10 + (long)pSVar11->localIndex_ * 0x18) =
               *(double *)(lVar4 + 0x10 + (long)pSVar11->localIndex_ * 0x18) -
               local_40.super_Vector<double,_3U>.data_[2];
          if (ppSVar7 == ppSVar3) {
            pSVar11 = (StuntDouble *)0x0;
          }
          else {
            pSVar11 = *ppSVar7;
          }
        } while (pSVar11 != (StuntDouble *)0x0);
      }
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)&this->fixedZMols_);
  }
  plVar1 = &this->movingZMols_;
  p_Var9 = (this->movingZMols_).
           super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  dVar15 = 0.0;
  if (p_Var9 != (_List_node_base *)plVar1) {
    do {
      pMVar2 = (Molecule *)p_Var9[1]._M_next;
      Molecule::getComVel(&local_40,pMVar2);
      dVar6 = local_40.super_Vector<double,_3U>.data_[2];
      RVar14 = Molecule::getMass(pMVar2);
      dVar15 = dVar15 + RVar14 * dVar6;
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)plVar1);
  }
  ppMVar10 = (this->unzconsMols_).
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppMVar8 = (this->unzconsMols_).
            super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppMVar10 != ppMVar8) {
    do {
      pMVar2 = *ppMVar10;
      Molecule::getComVel(&local_40,pMVar2);
      dVar6 = local_40.super_Vector<double,_3U>.data_[2];
      RVar14 = Molecule::getMass(pMVar2);
      dVar15 = dVar15 + RVar14 * dVar6;
      ppMVar10 = ppMVar10 + 1;
      ppMVar8 = (this->unzconsMols_).
                super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (ppMVar10 != ppMVar8);
  }
  dVar15 = dVar15 / (this->totMassMovingZMols_ + this->totMassUnconsMols_);
  for (p_Var9 = (this->movingZMols_).
                super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
                _M_impl._M_node.super__List_node_base._M_next; p_Var9 != (_List_node_base *)plVar1;
      p_Var9 = p_Var9->_M_next) {
    p_Var5 = p_Var9[1]._M_next;
    p_Var12 = p_Var5[10]._M_next;
    if (p_Var12 == *(_List_node_base **)((long)(p_Var5 + 10) + 8)) {
      p_Var13 = (_List_node_base *)0x0;
    }
    else {
      p_Var13 = p_Var12->_M_next;
    }
    if (p_Var13 != (_List_node_base *)0x0) {
      p_Var5 = *(_List_node_base **)((long)(p_Var5 + 10) + 8);
      do {
        p_Var12 = (_List_node_base *)&p_Var12->_M_prev;
        lVar4 = *(long *)((long)(*(_List_node_base **)
                                  ((long)(*(_List_node_base **)((long)(p_Var13 + 1) + 8) + 1) + 8) +
                                1) + 8U + (long)p_Var13[1]._M_next);
        *(double *)(lVar4 + 0x10 + (long)*(int *)&p_Var13[3]._M_next * 0x18) =
             *(double *)(lVar4 + 0x10 + (long)*(int *)&p_Var13[3]._M_next * 0x18) - dVar15;
        if (p_Var12 == p_Var5) {
          p_Var13 = (_List_node_base *)0x0;
        }
        else {
          p_Var13 = p_Var12->_M_next;
        }
      } while (p_Var13 != (_List_node_base *)0x0);
    }
  }
  for (ppMVar10 = (this->unzconsMols_).
                  super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppMVar10 != ppMVar8;
      ppMVar10 = ppMVar10 + 1) {
    pMVar2 = *ppMVar10;
    ppSVar7 = (pMVar2->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar7 ==
        (pMVar2->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar11 = (StuntDouble *)0x0;
    }
    else {
      pSVar11 = *ppSVar7;
    }
    if (pSVar11 != (StuntDouble *)0x0) {
      ppSVar3 = (pMVar2->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      do {
        ppSVar7 = ppSVar7 + 1;
        lVar4 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
        *(double *)(lVar4 + 0x10 + (long)pSVar11->localIndex_ * 0x18) =
             *(double *)(lVar4 + 0x10 + (long)pSVar11->localIndex_ * 0x18) - dVar15;
        if (ppSVar7 == ppSVar3) {
          pSVar11 = (StuntDouble *)0x0;
        }
        else {
          pSVar11 = *ppSVar7;
        }
      } while (pSVar11 != (StuntDouble *)0x0);
    }
  }
  return;
}

Assistant:

void ZConstraintForceModifier::zeroVelocity() {
    Vector3d comVel;
    Vector3d vel;
    std::list<ZconstraintMol>::iterator i;
    Molecule* mol;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;

    // Zero out the velocities of center of mass of fixed
    // z-constrained molecules
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol    = i->mol;
      comVel = mol->getComVel();

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= comVel[whichDirection];
        sd->setVel(vel);
      }
    }

    // Calculate the vz of center of mass of moving molecules
    // (including unconstrained molecules and moving z-constrained
    // molecules)

    RealType pzMovingMols = 0.0;

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol    = i->mol;
      comVel = mol->getComVel();
      pzMovingMols += mol->getMass() * comVel[whichDirection];
    }

    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol    = *j;
      comVel = mol->getComVel();
      pzMovingMols += mol->getMass() * comVel[whichDirection];
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &pzMovingMols, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    RealType vzMovingMols =
        pzMovingMols / (totMassMovingZMols_ + totMassUnconsMols_);

    // Modify the velocities of moving z-constrained molecules

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol = i->mol;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= vzMovingMols;
        sd->setVel(vel);
      }
    }

    // Modify the velocites of unconstrained molecules
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol = *j;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= vzMovingMols;
        sd->setVel(vel);
      }
    }
  }